

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

float tcu::unnormalize(WrapMode mode,float c,int size)

{
  uint uVar1;
  float fVar2;
  float __x;
  
  if (MIRRORED_ONCE < mode) {
    return 0.0;
  }
  if ((0x57U >> (mode & 0x1f) & 1) != 0) {
    return (float)size * c;
  }
  if (mode == REPEAT_CL) {
    fVar2 = floorf(c);
    fVar2 = c - fVar2;
  }
  else {
    __x = c * 0.5;
    fVar2 = floorf(__x);
    if ((__x - fVar2 != 0.5) || (NAN(__x - fVar2))) {
      fVar2 = floorf(__x + 0.5);
    }
    else {
      fVar2 = 0.0;
      if (((long)(__x + -0.5) & 1U) != 0) {
        fVar2 = 1.0;
      }
      fVar2 = __x + -0.5 + fVar2;
    }
    fVar2 = c - (fVar2 + fVar2);
    uVar1 = -(uint)(-fVar2 <= fVar2);
    fVar2 = (float)(~uVar1 & (uint)-fVar2 | (uint)fVar2 & uVar1);
  }
  return fVar2 * (float)size;
}

Assistant:

static inline float unnormalize (Sampler::WrapMode mode, float c, int size)
{
	switch (mode)
	{
		case tcu::Sampler::CLAMP_TO_EDGE:
		case tcu::Sampler::CLAMP_TO_BORDER:
		case tcu::Sampler::REPEAT_GL:
		case tcu::Sampler::MIRRORED_REPEAT_GL:
		case tcu::Sampler::MIRRORED_ONCE:		// Fall-through (ordinary case).
			return (float)size*c;

		case tcu::Sampler::REPEAT_CL:
			return (float)size * (c - deFloatFloor(c));

		case tcu::Sampler::MIRRORED_REPEAT_CL:
			return (float)size * deFloatAbs(c - 2.0f * rint(0.5f * c));

		default:
			DE_ASSERT(DE_FALSE);
			return 0.0f;
	}
}